

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O0

void __thiscall KDReports::Test::testHandler(Test *this)

{
  byte bVar1;
  bool bVar2;
  QStandardItem *pQVar3;
  QList<QString> *pQVar4;
  QString local_448;
  QString local_430;
  QString local_418;
  QChar local_3fc;
  QChar local_3fa;
  undefined1 local_3f8 [8];
  QString ptext;
  QTextDocument *doc;
  QString local_3c0;
  QString local_3a8;
  QString local_390;
  QString local_378;
  QString local_360;
  QString local_348;
  QString local_330;
  QString local_318;
  QString local_300;
  QString local_2e8;
  QString local_2d0;
  QString local_2b8;
  QString local_2a0;
  QString local_288;
  QString local_270;
  QString local_258;
  QString local_240;
  QString local_228;
  QString local_210;
  QString local_1f8;
  QString local_1e0;
  QString local_1c8;
  QString local_1b0;
  QString local_198;
  QString local_180;
  QString local_168;
  undefined1 local_150 [8];
  QStringList expectedCallbacks;
  QString local_130;
  QString local_118;
  QString local_100;
  undefined1 local_e1;
  QString local_e0;
  undefined1 local_c1;
  QString local_c0;
  QStandardItemModel local_a8 [8];
  QStandardItemModel model;
  undefined1 local_98 [8];
  TestXmlElementHandler handler;
  Report report;
  QFlags<QIODeviceBase::OpenModeFlag> local_48 [4];
  QString local_38;
  QFile local_20 [8];
  QFile file;
  Test *this_local;
  
  QString::QString(&local_38,":/handler.xml");
  QFile::QFile(local_20,(QString *)&local_38);
  QString::~QString(&local_38);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(local_48,ReadOnly);
  bVar1 = QFile::open((QFlags_conflict *)local_20);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xf1);
  if ((bVar1 & 1) != 0) {
    KDReports::Report::Report((Report *)&handler.mReport,(QObject *)0x0);
    TestXmlElementHandler::TestXmlElementHandler
              ((TestXmlElementHandler *)local_98,(Report *)&handler.mReport);
    KDReports::Report::setXmlElementHandler((XmlElementHandler *)&handler.mReport);
    QStandardItemModel::QStandardItemModel(local_a8,(QObject *)0x0);
    pQVar3 = (QStandardItem *)operator_new(0x10);
    local_c1 = 1;
    QString::QString(&local_c0,"modelCell");
    QStandardItem::QStandardItem(pQVar3,(QString *)&local_c0);
    local_c1 = 0;
    QStandardItemModel::setItem((int)local_a8,0,(QStandardItem *)0x0);
    QString::~QString(&local_c0);
    pQVar3 = (QStandardItem *)operator_new(0x10);
    local_e1 = 1;
    QString::QString(&local_e0,"<html><b>htmlCell</b>");
    QStandardItem::QStandardItem(pQVar3,(QString *)&local_e0);
    local_e1 = 0;
    QStandardItemModel::setItem((int)local_a8,0,(QStandardItem *)0x1);
    QString::~QString(&local_e0);
    QString::QString(&local_100,"model1");
    KDReports::Report::associateModel((QString *)&handler.mReport,(QAbstractItemModel *)&local_100);
    QString::~QString(&local_100);
    QString::QString(&local_118,"testModified");
    QString::QString(&local_130,"modified");
    KDReports::Report::associateTextValue((QString *)&handler.mReport,(QString *)&local_118);
    QString::~QString(&local_130);
    QString::~QString(&local_118);
    bVar1 = KDReports::Report::loadFromXML((QIODevice *)&handler.mReport,(ErrorDetails *)local_20);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xff);
    if ((bVar1 & 1) != 0) {
      KDReports::XmlElementHandler::errorDetails();
      bVar1 = KDReports::ErrorDetails::hasError();
      bVar1 = QTest::qVerify((bool)(~bVar1 & 1),"!handler.errorDetails().hasError()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0x100);
      KDReports::ErrorDetails::~ErrorDetails((ErrorDetails *)&expectedCallbacks.d.size);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        QList<QString>::QList((QList<QString> *)local_150);
        QString::QString(&local_168,"startReport");
        pQVar4 = QList<QString>::operator<<((QList<QString> *)local_150,&local_168);
        QString::QString(&local_180,"startHeader");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_180);
        QString::QString(&local_198,"imageElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_198);
        QString::QString(&local_1b0,"variable");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_1b0);
        QString::QString(&local_1c8,"endHeader");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_1c8);
        QString::QString(&local_1e0,"startFooter");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_1e0);
        QString::QString(&local_1f8,"textElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_1f8);
        QString::QString(&local_210,"endFooter");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_210);
        QString::QString(&local_228,"tabs");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_228);
        QString::QString(&local_240,"paragraph-margins");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_240);
        QString::QString(&local_258,"textElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_258);
        QString::QString(&local_270,"textElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_270);
        QString::QString(&local_288,"hLineElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_288);
        QString::QString(&local_2a0,"vspace");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_2a0);
        QString::QString(&local_2b8,"htmlElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_2b8);
        QString::QString(&local_2d0,"textElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_2d0);
        QString::QString(&local_2e8,"htmlElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_2e8);
        QString::QString(&local_300,"startTableElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_300);
        QString::QString(&local_318,"startCell");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_318);
        QString::QString(&local_330,"textElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_330);
        QString::QString(&local_348,"endCell");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_348);
        QString::QString(&local_360,"endTableElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_360);
        QString::QString(&local_378,"textElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_378);
        QString::QString(&local_390,"customElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_390);
        QString::QString(&local_3a8,"autoTableElement");
        pQVar4 = QList<QString>::operator<<(pQVar4,&local_3a8);
        QString::QString(&local_3c0,"endReport");
        QList<QString>::operator<<(pQVar4,&local_3c0);
        QString::~QString(&local_3c0);
        QString::~QString(&local_3a8);
        QString::~QString(&local_390);
        QString::~QString(&local_378);
        QString::~QString(&local_360);
        QString::~QString(&local_348);
        QString::~QString(&local_330);
        QString::~QString(&local_318);
        QString::~QString(&local_300);
        QString::~QString(&local_2e8);
        QString::~QString(&local_2d0);
        QString::~QString(&local_2b8);
        QString::~QString(&local_2a0);
        QString::~QString(&local_288);
        QString::~QString(&local_270);
        QString::~QString(&local_258);
        QString::~QString(&local_240);
        QString::~QString(&local_228);
        QString::~QString(&local_210);
        QString::~QString(&local_1f8);
        QString::~QString(&local_1e0);
        QString::~QString(&local_1c8);
        QString::~QString(&local_1b0);
        QString::~QString(&local_198);
        QString::~QString(&local_180);
        QString::~QString(&local_168);
        TestXmlElementHandler::callbacks((QStringList *)&doc,(TestXmlElementHandler *)local_98);
        bVar2 = QTest::qCompare<QString>
                          ((QList<QString> *)&doc,(QList<QString> *)local_150,"handler.callbacks()",
                           "expectedCallbacks",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x11d);
        QList<QString>::~QList((QList<QString> *)&doc);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          ptext.d.size = KDReports::Report::mainTextDocument();
          QTextDocument::toPlainText();
          QChar::QChar(&local_3fa,0xfffc);
          QChar::QChar(&local_3fc,'#');
          QString::replace((QChar *)local_3f8,(QChar *)(ulong)(ushort)local_3fa.ucs,
                           (uint)(ushort)local_3fc.ucs);
          QString::QString(&local_418,
                           "Title\n#\n \nTest used by XmlParser.cpp\nmodelCell\nhtmlCell\n\nTableElement example\n\nmodified\nCustom element\n\nmodelCell\nhtmlCell\n"
                          );
          bVar2 = QTest::qCompare((QString *)local_3f8,&local_418,"ptext",
                                  "QString(\"Title\\n#\\n \\nTest used by XmlParser.cpp\\nmodelCell\\nhtmlCell\\n\\nTableElement example\\n\\nmodified\\nCustom element\\n\\nmodelCell\\nhtmlCell\\n\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x126);
          QString::~QString(&local_418);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            KDReports::Report::mainTextDocument();
            QTextDocument::toPlainText();
            QTextDocument::toPlainText();
            QTest::qCompare(&local_430,&local_448,"report.mainTextDocument()->toPlainText()",
                            "doc.toPlainText()",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0x127);
            QString::~QString(&local_448);
            QString::~QString(&local_430);
          }
          QString::~QString((QString *)local_3f8);
        }
        QList<QString>::~QList((QList<QString> *)local_150);
      }
    }
    QStandardItemModel::~QStandardItemModel(local_a8);
    TestXmlElementHandler::~TestXmlElementHandler((TestXmlElementHandler *)local_98);
    KDReports::Report::~Report((Report *)&handler.mReport);
  }
  QFile::~QFile(local_20);
  return;
}

Assistant:

void testHandler()
    {
        QFile file(":/handler.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        TestXmlElementHandler handler(report);
        report.setXmlElementHandler(&handler);

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("modelCell"));
        // HTML cells need to start with "<html>" for KDReportsAutoTable
        // (not necessary if it's just for <html model="..." row="..." column="...">)
        model.setItem(0, 1, new QStandardItem("<html><b>htmlCell</b>"));
        report.associateModel("model1", &model);

        report.associateTextValue("testModified", "modified");

        QVERIFY(report.loadFromXML(&file));
        QVERIFY(!handler.errorDetails().hasError());
        QStringList expectedCallbacks;
        expectedCallbacks << "startReport"
                          << "startHeader"
                          << "imageElement"
                          << "variable"
                          << "endHeader"
                          << "startFooter"
                          << "textElement"
                          << "endFooter"
                          << "tabs"
                          << "paragraph-margins"
                          << "textElement"
                          << "textElement"
                          << "hLineElement"
                          << "vspace"
                          << "htmlElement"
                          << "textElement"
                          << "htmlElement"
                          << "startTableElement"
                          << "startCell"
                          << "textElement"
                          << "endCell"
                          << "endTableElement"
                          << "textElement"
                          << "customElement"
                          << "autoTableElement"
                          << "endReport";
        // qDebug() << handler.callbacks();
        QCOMPARE(handler.callbacks(), expectedCallbacks);
        QTextDocument &doc = *report.mainTextDocument();

        QString ptext = doc.toPlainText();

        // custom objects (such as HLineTextObject) are represented
        // as 0xFFFC
        ptext.replace(QChar(0xFFFC), '#');

        QCOMPARE(ptext, QString("Title\n#\n \nTest used by XmlParser.cpp\nmodelCell\nhtmlCell\n\nTableElement example\n\nmodified\nCustom element\n\nmodelCell\nhtmlCell\n"));
        QCOMPARE(report.mainTextDocument()->toPlainText(), doc.toPlainText());
    }